

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdNode * Cudd_VectorSupport(DdManager *dd,DdNode **F,int n)

{
  int *piVar1;
  bool bVar2;
  int *support;
  DdNode *g;
  DdNode *pDVar3;
  ulong uVar4;
  uint uVar5;
  uint index;
  ulong uVar6;
  DdNode *f;
  
  uVar5 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar5 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar5 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_008147c5:
    f = (DdNode *)0x0;
  }
  else {
    uVar4 = (ulong)uVar5;
    if (0 < (int)uVar5) {
      memset(support,0,uVar4 * 4);
    }
    if (0 < n) {
      uVar6 = 0;
      do {
        ddSupportStep((DdNode *)((ulong)F[uVar6] & 0xfffffffffffffffe),support);
        uVar6 = uVar6 + 1;
      } while ((uint)n != uVar6);
      if (0 < n) {
        uVar6 = 0;
        do {
          ddClearFlag((DdNode *)((ulong)F[uVar6] & 0xfffffffffffffffe));
          uVar6 = uVar6 + 1;
        } while ((uint)n != uVar6);
      }
    }
    f = dd->one;
    uVar6 = (ulong)f & 0xfffffffffffffffe;
    *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + 1;
    if (0 < (int)uVar5) {
      do {
        uVar5 = uVar5 - 1;
        index = uVar5;
        if ((long)uVar4 <= (long)dd->size) {
          index = dd->invperm[uVar4 - 1];
        }
        pDVar3 = f;
        if (support[(int)index] == 1) {
          g = cuddUniqueInter(dd,index,dd->one,(DdNode *)((ulong)dd->one ^ 1));
          piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar3 = Cudd_bddAnd(dd,f,g);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,f);
            Cudd_RecursiveDeref(dd,g);
            free(support);
            goto LAB_008147c5;
          }
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,f);
          Cudd_RecursiveDeref(dd,g);
        }
        bVar2 = 1 < uVar4;
        uVar4 = uVar4 - 1;
        f = pDVar3;
      } while (bVar2);
      uVar6 = (ulong)pDVar3 & 0xfffffffffffffffe;
    }
    free(support);
    *(int *)(uVar6 + 4) = *(int *)(uVar6 + 4) + -1;
  }
  return f;
}

Assistant:

DdNode *
Cudd_VectorSupport(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    DdNode *res, *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    /* Transform support from array to cube. */
    res = DD_ONE(dd);
    cuddRef(res);
    for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
        i = (j >= dd->size) ? j : dd->invperm[j];
        if (support[i] == 1) {
            var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
            cuddRef(var);
            tmp = Cudd_bddAnd(dd,res,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,res);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(support);
                return(NULL);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,res);
            Cudd_RecursiveDeref(dd,var);
            res = tmp;
        }
    }

    ABC_FREE(support);
    cuddDeref(res);
    return(res);

}